

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_14f11f6::cmForEachFunctionBlocker::Replay
          (cmForEachFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  pointer *pp_Var1;
  size_t sVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  undefined1 auVar5 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer pcVar7;
  undefined8 this_00;
  undefined8 functions_00;
  cmForEachFunctionBlocker *pcVar8;
  char cVar9;
  char cVar10;
  bool bVar11;
  InvokeResult IVar12;
  PolicyStatus PVar13;
  string *psVar14;
  string *psVar15;
  long *plVar16;
  _Rb_tree_node_base *p_Var17;
  uint uVar18;
  long *plVar19;
  cmMakefile *pcVar20;
  iterator __begin2;
  pointer pbVar21;
  value_type *__x;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  pointer pbVar25;
  pointer pcVar26;
  size_type sVar27;
  ulong uVar28;
  long lVar29;
  iterator __end2;
  ulong uVar30;
  cmMakefile *pcVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar33;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  oldDefs;
  vector<cmList,_std::allocator<cmList>_> values;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iterationVars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> iter_var_prefix;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<cmList,_std::allocator<cmList>_> local_c8;
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_a8;
  long lStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  pointer local_70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  cmForEachFunctionBlocker *local_38;
  
  sVar2 = this->IterationVarsCount;
  if (this->ZipLists == true) {
    if (sVar2 == 0) {
      __assert_fail("\"Unexpected number of iteration variables\" && this->IterationVarsCount >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmForEachCommand.cxx"
                    ,0x9b,
                    "bool (anonymous namespace)::cmForEachFunctionBlocker::ReplayZipLists(const std::vector<cmListFileFunction> &, cmExecutionStatus &)"
                   );
    }
    pcVar3 = inStatus->Makefile;
    local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_58.field_2._M_allocated_capacity = (size_type)functions;
    local_58.field_2._8_8_ = inStatus;
    std::vector<cmList,_std::allocator<cmList>_>::reserve
              (&local_c8,
               ((long)(this->Args).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->Args).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) - sVar2);
    pbVar25 = (this->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar15 = (this->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->IterationVarsCount;
    local_38 = this;
    if (psVar15 == pbVar25) {
      uVar24 = 0;
    }
    else {
      uVar24 = 0;
      local_70 = pbVar25;
      do {
        local_f8 = (undefined1  [8])0x0;
        pbStack_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_e8._M_dataplus._M_p = (pointer)0x0;
        psVar14 = cmMakefile::GetSafeDefinition(pcVar3,psVar15);
        pbVar6 = pbStack_f0;
        auVar5 = local_f8;
        if (psVar14->_M_string_length != 0) {
          if ((undefined1  [8])pbStack_f0 != local_f8) {
            paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_f8 + 0x10);
            do {
              plVar16 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(paVar32 + -1))->_M_dataplus)._M_p;
              if (paVar32 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar16) {
                operator_delete(plVar16,paVar32->_M_allocated_capacity + 1);
              }
              pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (paVar32 + 1);
              paVar32 = paVar32 + 2;
            } while (pbVar33 != pbVar6);
            pbStack_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar5
            ;
            pbVar25 = local_70;
          }
          cmList::Insert((container_type *)local_f8,(const_iterator)pbStack_f0,psVar14,Yes,Yes);
        }
        pbVar6 = pbStack_f0;
        auVar5 = local_f8;
        std::vector<cmList,_std::allocator<cmList>_>::emplace_back<cmList>
                  (&local_c8,(cmList *)local_f8);
        uVar28 = (long)pbVar6 - (long)auVar5 >> 5;
        if (uVar28 < uVar24) {
          uVar28 = uVar24;
        }
        uVar24 = uVar28;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_f8);
        psVar15 = psVar15 + 1;
      } while (psVar15 != pbVar25);
    }
    pcVar8 = local_38;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar27 = ((long)local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    if (local_38->IterationVarsCount < 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&local_88,sVar27);
      pbVar25 = (pcVar8->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_68[0]._M_current = &local_58;
      pcVar4 = (pbVar25->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar4,pcVar4 + pbVar25->_M_string_length);
      std::__cxx11::string::append((char *)local_68);
      local_70 = local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar23 = 0;
        pp_Var1 = &local_a8.
                   super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pbVar25 = local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          cVar10 = '\x01';
          if (9 < uVar23) {
            uVar28 = (ulong)uVar23;
            cVar9 = '\x04';
            do {
              cVar10 = cVar9;
              uVar18 = (uint)uVar28;
              if (uVar18 < 100) {
                cVar10 = cVar10 + -2;
                goto LAB_003f6fa3;
              }
              if (uVar18 < 1000) {
                cVar10 = cVar10 + -1;
                goto LAB_003f6fa3;
              }
              if (uVar18 < 10000) goto LAB_003f6fa3;
              uVar28 = uVar28 / 10000;
              cVar9 = cVar10 + '\x04';
            } while (99999 < uVar18);
            cVar10 = cVar10 + '\x01';
          }
LAB_003f6fa3:
          local_f8 = (undefined1  [8])&local_e8;
          std::__cxx11::string::_M_construct((ulong)local_f8,cVar10);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)local_f8,(_Rb_tree_color)pbStack_f0,uVar23);
          plVar16 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_f8,0,(char *)0x0,(ulong)local_68[0]._M_current);
          plVar19 = plVar16 + 2;
          if ((pointer *)*plVar16 == (pointer *)plVar19) {
            local_a8.
            super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar19;
            lStack_90 = plVar16[3];
            local_a8.
            super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pp_Var1;
          }
          else {
            local_a8.
            super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar19;
            local_a8.
            super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar16;
          }
          local_a8.
          super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar16[1];
          *plVar16 = (long)plVar19;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          if (local_f8 != (undefined1  [8])&local_e8) {
            operator_delete((void *)local_f8,(ulong)(local_e8._M_dataplus._M_p + 1));
          }
          std::__cxx11::string::operator=((string *)pbVar25,(string *)&local_a8);
          if (local_a8.
              super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)pp_Var1) {
            operator_delete(local_a8.
                            super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&(local_a8.
                                            super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_current + 1));
          }
          uVar23 = uVar23 + 1;
          pbVar25 = pbVar25 + 1;
        } while (pbVar25 != local_70);
      }
      if (local_68[0]._M_current != &local_58) {
        operator_delete(local_68[0]._M_current,(ulong)(local_58._M_dataplus._M_p + 1));
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_88,sVar27);
      if (0 < (long)pcVar8->IterationVarsCount) {
        __x = (pcVar8->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        lVar29 = pcVar8->IterationVarsCount + 1;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_88,__x);
          __x = __x + 1;
          lVar29 = lVar29 + -1;
        } while (1 < lVar29);
      }
    }
    sVar27 = ((long)local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    if ((long)local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 != sVar27) {
      __assert_fail("\"Sanity check\" && iterationVars.size() == values.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmForEachCommand.cxx"
                    ,0xc3,
                    "bool (anonymous namespace)::cmForEachFunctionBlocker::ReplayZipLists(const std::vector<cmListFileFunction> &, cmExecutionStatus &)"
                   );
    }
    local_e8._M_string_length = (size_type)&pbStack_f0;
    pbStack_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)pbStack_f0 & 0xffffffff00000000);
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8.field_2._8_8_ = 0;
    local_e8.field_2._M_allocated_capacity = local_e8._M_string_length;
    if (local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.super__Vector_impl_data
        ._M_finish !=
        local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.super__Vector_impl_data
        ._M_start) {
      uVar28 = 1;
      uVar30 = 0;
      do {
        uVar22 = uVar28;
        psVar15 = local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar30;
        PVar13 = cmMakefile::GetPolicyStatus(pcVar3,CMP0124,false);
        if (PVar13 == NEW) {
          bVar11 = cmMakefile::IsNormalDefinitionSet(pcVar3,psVar15);
          if (bVar11) {
            psVar14 = (string *)cmMakefile::GetDefinition(pcVar3,psVar15);
            if (psVar14 == (string *)0x0) {
              psVar14 = &cmValue::Empty_abi_cxx11_;
            }
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)local_f8,psVar15,psVar14);
          }
          else {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,std::nullopt_t_const&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                        *)local_f8,psVar15,(nullopt_t *)&std::nullopt);
          }
        }
        else {
          psVar14 = cmMakefile::GetSafeDefinition(pcVar3,psVar15);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
                      *)local_f8,psVar15,psVar14);
        }
        sVar27 = ((long)local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        uVar28 = (ulong)((int)uVar22 + 1);
        uVar30 = uVar22;
      } while (uVar22 <= sVar27 && sVar27 - uVar22 != 0);
    }
    local_a8.
    super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::reserve(&local_a8,sVar27);
    pcVar7 = local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      pcVar26 = local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        local_68[0]._M_current =
             (pcVar26->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
        ::
        emplace_back<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    *)&local_a8,local_68);
        pcVar26 = pcVar26 + 1;
      } while (pcVar26 != pcVar7);
    }
    functions_00 = local_58.field_2._8_8_;
    this_00 = local_58.field_2._M_allocated_capacity;
    pcVar20 = (cmMakefile *)
              (((long)local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    if ((cmMakefile *)
        ((long)local_a8.
               super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_a8.
               super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) != pcVar20) {
      __assert_fail("\"Sanity check\" && positions.size() == values.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmForEachCommand.cxx"
                    ,0xd9,
                    "bool (anonymous namespace)::cmForEachFunctionBlocker::ReplayZipLists(const std::vector<cmListFileFunction> &, cmExecutionStatus &)"
                   );
    }
    uVar28 = 0;
    if (uVar24 == 0) {
      IVar12.Restore = false;
      IVar12.Break = false;
    }
    else {
      do {
        if (local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar23 = 1;
          pcVar31 = (cmMakefile *)0x0;
          do {
            pbVar25 = local_a8.
                      super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pcVar31]._M_current;
            if (pbVar25 ==
                local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                super__Vector_impl_data._M_start[(long)pcVar31].Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              cmMakefile::RemoveDefinition
                        (pcVar3,local_88.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)pcVar31);
            }
            else {
              value_01._M_str = (pbVar25->_M_dataplus)._M_p;
              value_01._M_len = pbVar25->_M_string_length;
              cmMakefile::AddDefinition
                        (pcVar3,local_88.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)pcVar31,value_01);
              local_a8.
              super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pcVar31]._M_current =
                   local_a8.
                   super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)pcVar31]._M_current + 1;
            }
            pcVar31 = (cmMakefile *)(ulong)uVar23;
            pcVar20 = (cmMakefile *)
                      (((long)local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_c8.super__Vector_base<cmList,_std::allocator<cmList>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
            uVar23 = uVar23 + 1;
          } while (pcVar31 <= pcVar20 && (long)pcVar20 - (long)pcVar31 != 0);
        }
        IVar12 = invoke((cmForEachFunctionBlocker *)this_00,
                        (vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                        functions_00,(cmExecutionStatus *)pcVar3,pcVar20);
        pcVar20 = (cmMakefile *)(ulong)(ushort)IVar12;
      } while (((ushort)IVar12 < 0x100) && (uVar28 = (ulong)((int)uVar28 + 1), uVar28 < uVar24));
    }
    p_Var17 = (_Rb_tree_node_base *)local_e8._M_string_length;
    if (((_Rb_tree_node_base *)local_e8._M_string_length != (_Rb_tree_node_base *)&pbStack_f0 &
        IVar12.Restore) == 1) {
      do {
        if ((char)p_Var17[3]._M_color == _S_black) {
          value_02._M_str = *(char **)(p_Var17 + 2);
          value_02._M_len = (size_t)p_Var17[2]._M_parent;
          cmMakefile::AddDefinition(pcVar3,(string *)(p_Var17 + 1),value_02);
        }
        else {
          cmMakefile::RemoveDefinition(pcVar3,(string *)(p_Var17 + 1));
        }
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
      } while (p_Var17 != (_Rb_tree_node_base *)&pbStack_f0);
    }
    if (local_a8.
        super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    std::vector<cmList,_std::allocator<cmList>_>::~vector(&local_c8);
  }
  else {
    if (sVar2 != 1) {
      __assert_fail("\"Unexpected number of iteration variables\" && this->IterationVarsCount == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmForEachCommand.cxx"
                    ,0x71,
                    "bool (anonymous namespace)::cmForEachFunctionBlocker::ReplayItems(const std::vector<cmListFileFunction> &, cmExecutionStatus &)"
                   );
    }
    pcVar3 = inStatus->Makefile;
    local_e8.field_2._M_allocated_capacity =
         local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    PVar13 = cmMakefile::GetPolicyStatus(pcVar3,CMP0124,false);
    psVar15 = (this->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (PVar13 == NEW) {
      bVar11 = cmMakefile::IsNormalDefinitionSet(pcVar3,psVar15);
      if (bVar11) {
        psVar15 = (string *)
                  cmMakefile::GetDefinition
                            (pcVar3,(this->Args).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        if (psVar15 == (string *)0x0) {
          psVar15 = &cmValue::Empty_abi_cxx11_;
        }
        std::optional<std::__cxx11::string>::operator=
                  ((optional<std::__cxx11::string> *)local_f8,psVar15);
      }
    }
    else {
      psVar15 = cmMakefile::GetSafeDefinition(pcVar3,psVar15);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)local_f8,psVar15);
    }
    pbVar25 = (this->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar21 = (this->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
    if (pbVar21 != pbVar25) {
      do {
        pcVar20 = (cmMakefile *)(pbVar21->_M_dataplus)._M_p;
        value._M_str = (char *)pcVar20;
        value._M_len = pbVar21->_M_string_length;
        cmMakefile::AddDefinition
                  (pcVar3,(this->Args).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,value);
        IVar12 = invoke((cmForEachFunctionBlocker *)functions,
                        (vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)inStatus,
                        (cmExecutionStatus *)pcVar3,pcVar20);
        if (0xff < (ushort)IVar12) break;
        pbVar21 = pbVar21 + 1;
      } while (pbVar21 != pbVar25);
      if (((ushort)IVar12 & 1) != 0) {
        psVar15 = (this->Args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_e8.field_2._M_local_buf[0] == '\x01') {
          value_00._M_str = (char *)local_f8;
          value_00._M_len = (size_t)pbStack_f0;
          cmMakefile::AddDefinition(pcVar3,psVar15,value_00);
        }
        else {
          cmMakefile::RemoveDefinition(pcVar3,psVar15);
        }
      }
    }
    if ((local_e8.field_2._M_local_buf[0] == '\x01') &&
       (local_e8.field_2._M_allocated_capacity =
             local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00,
       local_f8 != (undefined1  [8])&local_e8)) {
      operator_delete((void *)local_f8,(ulong)(local_e8._M_dataplus._M_p + 1));
    }
  }
  return true;
}

Assistant:

bool cmForEachFunctionBlocker::Replay(
  std::vector<cmListFileFunction> functions, cmExecutionStatus& inStatus)
{
  return this->ZipLists ? this->ReplayZipLists(functions, inStatus)
                        : this->ReplayItems(functions, inStatus);
}